

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

void absl::lts_20250127::log_internal::RemoveLogSink(LogSink *sink)

{
  GlobalLogSinkSet *this;
  LogSink *sink_local;
  
  this = anon_unknown_0::GlobalSinks();
  anon_unknown_0::GlobalLogSinkSet::RemoveLogSink(this,sink);
  return;
}

Assistant:

void RemoveLogSink(absl::LogSink* sink) {
  log_internal::GlobalSinks().RemoveLogSink(sink);
}